

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_btst_8_s_ix(void)

{
  uint uVar1;
  uint uVar2;
  uint bit;
  
  uVar1 = m68ki_read_imm_8();
  uVar2 = OPER_AY_IX_8();
  m68ki_cpu.not_z_flag = uVar2 & 1 << ((byte)uVar1 & 7);
  return;
}

Assistant:

static void m68k_op_btst_8_s_ix(void)
{
	uint bit = OPER_I_8() & 7;

	FLAG_Z = OPER_AY_IX_8() & (1 << bit);
}